

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_info_set_(MPIABI_Fint *info,char *key,char *value,MPIABI_Fint *ierror,size_t key_len,
                     size_t value_len)

{
  mpi_info_set_();
  return;
}

Assistant:

void mpiabi_info_set_(
  const MPIABI_Fint * info,
  const char * key,
  const char * value,
  MPIABI_Fint * ierror,
  size_t key_len,
  size_t value_len
) {
  return mpi_info_set_(
    info,
    key,
    value,
    ierror,
    key_len,
    value_len
  );
}